

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.h
# Opt level: O2

void __thiscall wallet::SQLiteBatch::~SQLiteBatch(SQLiteBatch *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_DatabaseBatch)._vptr_DatabaseBatch = (_func_int **)&PTR_ReadKey_0063f6b0;
  Close(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::unique_ptr<wallet::SQliteExecHandler,_std::default_delete<wallet::SQliteExecHandler>_>::
    ~unique_ptr(&this->m_exec_handler);
    return;
  }
  __stack_chk_fail();
}

Assistant:

~SQLiteBatch() override { Close(); }